

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_primitives.cc
# Opt level: O2

uint64_t hashall(substring s,uint64_t h)

{
  uint64_t uVar1;
  
  uVar1 = uniform_hash(s.begin,(long)s.end - (long)s.begin,h);
  return uVar1;
}

Assistant:

uint64_t hashall(substring s, uint64_t h) { return uniform_hash((unsigned char*)s.begin, s.end - s.begin, h); }